

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

uchar * stbtt_GetGlyphSDF(stbtt_fontinfo *info,float scale,int glyph,int padding,uchar onedge_value,
                         float pixel_dist_scale,int *width,int *height,int *xoff,int *yoff)

{
  int nverts;
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  double dVar16;
  float local_1bc;
  float local_1b8;
  float local_1b4;
  float local_1b0;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float d;
  float c_1;
  float b_1;
  float root;
  float discriminant;
  float c;
  float b;
  float a;
  float a_inv;
  float it;
  float t_1;
  float py_1;
  float px_1;
  float res [3];
  float my;
  float mx;
  float by_1;
  float bx_1;
  float ay;
  float ax;
  int num;
  float box_y1;
  float box_x1;
  float box_y0;
  float box_x0;
  float y1_3;
  float x1_3;
  float y2_1;
  float x2_1;
  float t;
  float py;
  float px;
  float dy;
  float dx;
  float dist_1;
  float y1_2;
  float x1_2;
  float dist2;
  float y0_2;
  float x0_2;
  int winding;
  float y_gspace;
  float x_gspace;
  float sy;
  float sx;
  float min_dist;
  float val;
  float len2;
  float by;
  float bx;
  float y0_1;
  float x0_1;
  float y1_1;
  float x1_1;
  float y2;
  float x2;
  float dist;
  float y1;
  float x1;
  float y0;
  float x0;
  int num_verts;
  stbtt_vertex *verts;
  float *precompute;
  int j;
  int i;
  int y;
  int x;
  uchar *data;
  int h;
  int w;
  int iy1;
  int ix1;
  int iy0;
  int ix0;
  float scale_y;
  float scale_x;
  int *height_local;
  int *width_local;
  byte local_25;
  float pixel_dist_scale_local;
  int iStack_20;
  uchar onedge_value_local;
  int padding_local;
  int glyph_local;
  float scale_local;
  stbtt_fontinfo *info_local;
  
  if ((scale != 0.0) || (NAN(scale))) {
    iy0 = (int)scale;
    ix0 = (int)scale;
    _scale_y = height;
    height_local = width;
    width_local._4_4_ = pixel_dist_scale;
    local_25 = onedge_value;
    pixel_dist_scale_local = (float)padding;
    iStack_20 = glyph;
    padding_local = (int)scale;
    _glyph_local = info;
    stbtt_GetGlyphBitmapBoxSubpixel(info,glyph,scale,scale,0.0,0.0,&ix1,&iy1,&w,&h);
    if ((ix1 == w) || (iy1 == h)) {
      info_local = (stbtt_fontinfo *)0x0;
    }
    else {
      ix1 = ix1 - (int)pixel_dist_scale_local;
      iy1 = iy1 - (int)pixel_dist_scale_local;
      w = (int)pixel_dist_scale_local + w;
      h = (int)pixel_dist_scale_local + h;
      data._4_4_ = w - ix1;
      data._0_4_ = h - iy1;
      if (height_local != (int *)0x0) {
        *height_local = data._4_4_;
      }
      if (_scale_y != (int *)0x0) {
        *_scale_y = (int)data;
      }
      if (xoff != (int *)0x0) {
        *xoff = ix1;
      }
      if (yoff != (int *)0x0) {
        *yoff = iy1;
      }
      iy0 = iy0 ^ 0x80000000;
      nverts = stbtt_GetGlyphShape(_glyph_local,iStack_20,(stbtt_vertex **)&x0);
      _y = (stbtt_fontinfo *)malloc((long)(data._4_4_ * (int)data));
      verts = (stbtt_vertex *)malloc((long)nverts << 2);
      precompute._0_4_ = nverts + -1;
      for (precompute._4_4_ = 0; precompute._4_4_ < nverts; precompute._4_4_ = precompute._4_4_ + 1)
      {
        if (_x0[precompute._4_4_].type == '\x02') {
          fVar2 = (float)(int)_x0[precompute._4_4_].x * (float)ix0;
          fVar3 = (float)(int)_x0[precompute._4_4_].y * (float)iy0;
          fVar4 = (float)(int)_x0[(int)precompute].x * (float)ix0;
          fVar5 = (float)(int)_x0[(int)precompute].y * (float)iy0;
          dVar16 = sqrt((double)((fVar4 - fVar2) * (fVar4 - fVar2) +
                                (fVar5 - fVar3) * (fVar5 - fVar3)));
          local_18c = (float)dVar16;
          if ((local_18c != 0.0) || (NAN(local_18c))) {
            local_18c = 1.0 / local_18c;
          }
          else {
            local_18c = 0.0;
          }
          *(float *)(&verts->x + (long)precompute._4_4_ * 2) = local_18c;
        }
        else if (_x0[precompute._4_4_].type == '\x03') {
          fVar2 = (float)(int)_x0[precompute._4_4_].cx * (float)ix0;
          fVar3 = (float)(int)_x0[precompute._4_4_].cy * (float)iy0;
          fVar2 = ((float)(int)_x0[precompute._4_4_].x * (float)ix0 - (fVar2 + fVar2)) +
                  (float)(int)_x0[(int)precompute].x * (float)ix0;
          fVar3 = ((float)(int)_x0[precompute._4_4_].y * (float)iy0 - (fVar3 + fVar3)) +
                  (float)(int)_x0[(int)precompute].y * (float)iy0;
          fVar4 = fVar2 * fVar2 + fVar3 * fVar3;
          if ((fVar4 != 0.0) || (NAN(fVar4))) {
            *(float *)(&verts->x + (long)precompute._4_4_ * 2) =
                 1.0 / (fVar2 * fVar2 + fVar3 * fVar3);
          }
          else {
            *(undefined4 *)(&verts->x + (long)precompute._4_4_ * 2) = 0;
          }
        }
        else {
          *(undefined4 *)(&verts->x + (long)precompute._4_4_ * 2) = 0;
        }
        precompute._0_4_ = precompute._4_4_;
      }
      for (j = iy1; j < h; j = j + 1) {
        for (i = ix1; i < w; i = i + 1) {
          sy = 999999.0;
          fVar2 = (float)i + 0.5;
          fVar3 = (float)j + 0.5;
          iVar1 = stbtt__compute_crossings_x(fVar2 / (float)ix0,fVar3 / (float)iy0,nverts,_x0);
          for (precompute._4_4_ = 0; precompute._4_4_ < nverts;
              precompute._4_4_ = precompute._4_4_ + 1) {
            fVar4 = (float)(int)_x0[precompute._4_4_].x * (float)ix0;
            fVar5 = (float)(int)_x0[precompute._4_4_].y * (float)iy0;
            fVar6 = (fVar4 - fVar2) * (fVar4 - fVar2) + (fVar5 - fVar3) * (fVar5 - fVar3);
            if (fVar6 < sy * sy) {
              dVar16 = sqrt((double)fVar6);
              sy = (float)dVar16;
            }
            if (_x0[precompute._4_4_].type == '\x02') {
              fVar7 = (float)(int)_x0[precompute._4_4_ + -1].x * (float)ix0;
              fVar8 = (float)(int)_x0[precompute._4_4_ + -1].y * (float)iy0;
              fVar6 = ABS((fVar7 - fVar4) * (fVar5 - fVar3) + -((fVar8 - fVar5) * (fVar4 - fVar2)))
                      * *(float *)(&verts->x + (long)precompute._4_4_ * 2);
              if (precompute._4_4_ == 0) {
                __assert_fail("i != 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_truetype.h"
                              ,0x11fc,
                              "unsigned char *stbtt_GetGlyphSDF(const stbtt_fontinfo *, float, int, int, unsigned char, float, int *, int *, int *, int *)"
                             );
              }
              if (fVar6 < sy) {
                fVar7 = fVar7 - fVar4;
                fVar8 = fVar8 - fVar5;
                fVar4 = -((fVar4 - fVar2) * fVar7 + (fVar5 - fVar3) * fVar8) /
                        (fVar7 * fVar7 + fVar8 * fVar8);
                if ((0.0 <= fVar4) && (fVar4 <= 1.0)) {
                  sy = fVar6;
                }
              }
            }
            else if (_x0[precompute._4_4_].type == '\x03') {
              fVar6 = (float)(int)_x0[precompute._4_4_ + -1].x * (float)ix0;
              fVar7 = (float)(int)_x0[precompute._4_4_ + -1].y * (float)iy0;
              fVar8 = (float)(int)_x0[precompute._4_4_].cx * (float)ix0;
              fVar9 = (float)(int)_x0[precompute._4_4_].cy * (float)iy0;
              local_190 = fVar8;
              if (fVar4 < fVar8) {
                local_190 = fVar4;
              }
              local_198 = fVar6;
              if (local_190 < fVar6) {
                local_194 = fVar8;
                if (fVar4 < fVar8) {
                  local_194 = fVar4;
                }
                local_198 = local_194;
              }
              local_19c = fVar9;
              if (fVar5 < fVar9) {
                local_19c = fVar5;
              }
              local_1a4 = fVar7;
              if (local_19c < fVar7) {
                local_1a0 = fVar9;
                if (fVar5 < fVar9) {
                  local_1a0 = fVar5;
                }
                local_1a4 = local_1a0;
              }
              local_1a8 = fVar4;
              if (fVar4 < fVar8) {
                local_1a8 = fVar8;
              }
              local_1ac = fVar6;
              if (fVar6 <= local_1a8) {
                local_1b0 = fVar4;
                if (fVar4 < fVar8) {
                  local_1b0 = fVar8;
                }
                local_1ac = local_1b0;
              }
              local_1b4 = fVar5;
              if (fVar5 < fVar9) {
                local_1b4 = fVar9;
              }
              local_1b8 = fVar7;
              if (fVar7 <= local_1b4) {
                local_1bc = fVar5;
                if (fVar5 < fVar9) {
                  local_1bc = fVar9;
                }
                local_1b8 = local_1bc;
              }
              if ((((local_198 - sy < fVar2) && (fVar2 < local_1ac + sy)) &&
                  (local_1a4 - sy < fVar3)) && (fVar3 < local_1b8 + sy)) {
                ay = 0.0;
                fVar10 = fVar8 - fVar4;
                fVar11 = fVar9 - fVar5;
                fVar12 = (fVar4 - (fVar8 + fVar8)) + fVar6;
                fVar13 = (fVar5 - (fVar9 + fVar9)) + fVar7;
                res[2] = fVar4 - fVar2;
                res[1] = fVar5 - fVar3;
                fVar14 = *(float *)(&verts->x + (long)precompute._4_4_ * 2);
                if ((fVar14 != 0.0) || (NAN(fVar14))) {
                  fVar15 = fVar10 * fVar10 + fVar11 * fVar11;
                  ay = (float)stbtt__solve_cubic((fVar10 * fVar12 + fVar11 * fVar13) * 3.0 * fVar14,
                                                 (fVar15 + fVar15 +
                                                 res[2] * fVar12 + res[1] * fVar13) * fVar14,
                                                 (res[2] * fVar10 + res[1] * fVar11) * fVar14,&py_1)
                  ;
                }
                else {
                  fVar14 = (fVar10 * fVar12 + fVar11 * fVar13) * 3.0;
                  fVar15 = fVar10 * fVar10 + fVar11 * fVar11;
                  fVar12 = fVar15 + fVar15 + res[2] * fVar12 + res[1] * fVar13;
                  fVar10 = res[2] * fVar10 + res[1] * fVar11;
                  if ((fVar14 != 0.0) || (NAN(fVar14))) {
                    fVar10 = fVar12 * fVar12 + -(fVar14 * 4.0 * fVar10);
                    if (0.0 <= fVar10) {
                      dVar16 = sqrt((double)fVar10);
                      py_1 = (-fVar12 - (float)dVar16) / (fVar14 * 2.0);
                      px_1 = (-fVar12 + (float)dVar16) / (fVar14 * 2.0);
                      ay = 2.8026e-45;
                    }
                    else {
                      ay = 0.0;
                    }
                  }
                  else if ((fVar12 != 0.0) || (NAN(fVar12))) {
                    py_1 = -fVar10 / fVar12;
                    ay = 1.4013e-45;
                  }
                }
                if (((0 < (int)ay) && (0.0 <= py_1)) && (py_1 <= 1.0)) {
                  fVar14 = 1.0 - py_1;
                  fVar10 = py_1 * py_1 * fVar6 +
                           fVar14 * fVar14 * fVar4 + py_1 * 2.0 * fVar14 * fVar8;
                  fVar14 = py_1 * py_1 * fVar7 +
                           fVar14 * fVar14 * fVar5 + py_1 * 2.0 * fVar14 * fVar9;
                  fVar14 = (fVar10 - fVar2) * (fVar10 - fVar2) + (fVar14 - fVar3) * (fVar14 - fVar3)
                  ;
                  if (fVar14 < sy * sy) {
                    dVar16 = sqrt((double)fVar14);
                    sy = (float)dVar16;
                  }
                }
                if (((1 < (int)ay) && (0.0 <= px_1)) && (px_1 <= 1.0)) {
                  fVar14 = 1.0 - px_1;
                  fVar10 = px_1 * px_1 * fVar6 +
                           fVar14 * fVar14 * fVar4 + px_1 * 2.0 * fVar14 * fVar8;
                  fVar14 = px_1 * px_1 * fVar7 +
                           fVar14 * fVar14 * fVar5 + px_1 * 2.0 * fVar14 * fVar9;
                  fVar14 = (fVar10 - fVar2) * (fVar10 - fVar2) + (fVar14 - fVar3) * (fVar14 - fVar3)
                  ;
                  if (fVar14 < sy * sy) {
                    dVar16 = sqrt((double)fVar14);
                    sy = (float)dVar16;
                  }
                }
                if (((2 < (int)ay) && (0.0 <= res[0])) && (res[0] <= 1.0)) {
                  fVar14 = 1.0 - res[0];
                  fVar4 = res[0] * res[0] * fVar6 +
                          fVar14 * fVar14 * fVar4 + res[0] * 2.0 * fVar14 * fVar8;
                  fVar5 = res[0] * res[0] * fVar7 +
                          fVar14 * fVar14 * fVar5 + res[0] * 2.0 * fVar14 * fVar9;
                  fVar4 = (fVar4 - fVar2) * (fVar4 - fVar2) + (fVar5 - fVar3) * (fVar5 - fVar3);
                  if (fVar4 < sy * sy) {
                    dVar16 = sqrt((double)fVar4);
                    sy = (float)dVar16;
                  }
                }
              }
            }
          }
          if (iVar1 == 0) {
            sy = -sy;
          }
          sx = width_local._4_4_ * sy + (float)local_25;
          if (0.0 <= sx) {
            if (255.0 < sx) {
              sx = 255.0;
            }
          }
          else {
            sx = 0.0;
          }
          *(char *)((long)&_y->userdata + (long)((j - iy1) * data._4_4_ + (i - ix1))) =
               (char)(int)sx;
        }
      }
      free(verts);
      free(_x0);
      info_local = _y;
    }
  }
  else {
    info_local = (stbtt_fontinfo *)0x0;
  }
  return (uchar *)info_local;
}

Assistant:

STBTT_DEF unsigned char * stbtt_GetGlyphSDF(const stbtt_fontinfo *info, float scale, int glyph, int padding, unsigned char onedge_value, float pixel_dist_scale, int *width, int *height, int *xoff, int *yoff)
{
   float scale_x = scale, scale_y = scale;
   int ix0,iy0,ix1,iy1;
   int w,h;
   unsigned char *data;

   if (scale == 0) return NULL;

   stbtt_GetGlyphBitmapBoxSubpixel(info, glyph, scale, scale, 0.0f,0.0f, &ix0,&iy0,&ix1,&iy1);

   // if empty, return NULL
   if (ix0 == ix1 || iy0 == iy1)
      return NULL;

   ix0 -= padding;
   iy0 -= padding;
   ix1 += padding;
   iy1 += padding;

   w = (ix1 - ix0);
   h = (iy1 - iy0);

   if (width ) *width  = w;
   if (height) *height = h;
   if (xoff  ) *xoff   = ix0;
   if (yoff  ) *yoff   = iy0;

   // invert for y-downwards bitmaps
   scale_y = -scale_y;

   {
      int x,y,i,j;
      float *precompute;
      stbtt_vertex *verts;
      int num_verts = stbtt_GetGlyphShape(info, glyph, &verts);
      data = (unsigned char *) STBTT_malloc(w * h, info->userdata);
      precompute = (float *) STBTT_malloc(num_verts * sizeof(float), info->userdata);

      for (i=0,j=num_verts-1; i < num_verts; j=i++) {
         if (verts[i].type == STBTT_vline) {
            float x0 = verts[i].x*scale_x, y0 = verts[i].y*scale_y;
            float x1 = verts[j].x*scale_x, y1 = verts[j].y*scale_y;
            float dist = (float) STBTT_sqrt((x1-x0)*(x1-x0) + (y1-y0)*(y1-y0));
            precompute[i] = (dist == 0) ? 0.0f : 1.0f / dist;
         } else if (verts[i].type == STBTT_vcurve) {
            float x2 = verts[j].x *scale_x, y2 = verts[j].y *scale_y;
            float x1 = verts[i].cx*scale_x, y1 = verts[i].cy*scale_y;
            float x0 = verts[i].x *scale_x, y0 = verts[i].y *scale_y;
            float bx = x0 - 2*x1 + x2, by = y0 - 2*y1 + y2;
            float len2 = bx*bx + by*by;
            if (len2 != 0.0f)
               precompute[i] = 1.0f / (bx*bx + by*by);
            else
               precompute[i] = 0.0f;
         } else
            precompute[i] = 0.0f;
      }

      for (y=iy0; y < iy1; ++y) {
         for (x=ix0; x < ix1; ++x) {
            float val;
            float min_dist = 999999.0f;
            float sx = (float) x + 0.5f;
            float sy = (float) y + 0.5f;
            float x_gspace = (sx / scale_x);
            float y_gspace = (sy / scale_y);

            int winding = stbtt__compute_crossings_x(x_gspace, y_gspace, num_verts, verts); // @OPTIMIZE: this could just be a rasterization, but needs to be line vs. non-tesselated curves so a new path

            for (i=0; i < num_verts; ++i) {
               float x0 = verts[i].x*scale_x, y0 = verts[i].y*scale_y;

               // check against every point here rather than inside line/curve primitives -- @TODO: wrong if multiple 'moves' in a row produce a garbage point, and given culling, probably more efficient to do within line/curve
               float dist2 = (x0-sx)*(x0-sx) + (y0-sy)*(y0-sy);
               if (dist2 < min_dist*min_dist)
                  min_dist = (float) STBTT_sqrt(dist2);

               if (verts[i].type == STBTT_vline) {
                  float x1 = verts[i-1].x*scale_x, y1 = verts[i-1].y*scale_y;

                  // coarse culling against bbox
                  //if (sx > STBTT_min(x0,x1)-min_dist && sx < STBTT_max(x0,x1)+min_dist &&
                  //    sy > STBTT_min(y0,y1)-min_dist && sy < STBTT_max(y0,y1)+min_dist)
                  float dist = (float) STBTT_fabs((x1-x0)*(y0-sy) - (y1-y0)*(x0-sx)) * precompute[i];
                  STBTT_assert(i != 0);
                  if (dist < min_dist) {
                     // check position along line
                     // x' = x0 + t*(x1-x0), y' = y0 + t*(y1-y0)
                     // minimize (x'-sx)*(x'-sx)+(y'-sy)*(y'-sy)
                     float dx = x1-x0, dy = y1-y0;
                     float px = x0-sx, py = y0-sy;
                     // minimize (px+t*dx)^2 + (py+t*dy)^2 = px*px + 2*px*dx*t + t^2*dx*dx + py*py + 2*py*dy*t + t^2*dy*dy
                     // derivative: 2*px*dx + 2*py*dy + (2*dx*dx+2*dy*dy)*t, set to 0 and solve
                     float t = -(px*dx + py*dy) / (dx*dx + dy*dy);
                     if (t >= 0.0f && t <= 1.0f)
                        min_dist = dist;
                  }
               } else if (verts[i].type == STBTT_vcurve) {
                  float x2 = verts[i-1].x *scale_x, y2 = verts[i-1].y *scale_y;
                  float x1 = verts[i  ].cx*scale_x, y1 = verts[i  ].cy*scale_y;
                  float box_x0 = STBTT_min(STBTT_min(x0,x1),x2);
                  float box_y0 = STBTT_min(STBTT_min(y0,y1),y2);
                  float box_x1 = STBTT_max(STBTT_max(x0,x1),x2);
                  float box_y1 = STBTT_max(STBTT_max(y0,y1),y2);
                  // coarse culling against bbox to avoid computing cubic unnecessarily
                  if (sx > box_x0-min_dist && sx < box_x1+min_dist && sy > box_y0-min_dist && sy < box_y1+min_dist) {
                     int num=0;
                     float ax = x1-x0, ay = y1-y0;
                     float bx = x0 - 2*x1 + x2, by = y0 - 2*y1 + y2;
                     float mx = x0 - sx, my = y0 - sy;
                     float res[3],px,py,t,it;
                     float a_inv = precompute[i];
                     if (a_inv == 0.0) { // if a_inv is 0, it's 2nd degree so use quadratic formula
                        float a = 3*(ax*bx + ay*by);
                        float b = 2*(ax*ax + ay*ay) + (mx*bx+my*by);
                        float c = mx*ax+my*ay;
                        if (a == 0.0) { // if a is 0, it's linear
                           if (b != 0.0) {
                              res[num++] = -c/b;
                           }
                        } else {
                           float discriminant = b*b - 4*a*c;
                           if (discriminant < 0)
                              num = 0;
                           else {
                              float root = (float) STBTT_sqrt(discriminant);
                              res[0] = (-b - root)/(2*a);
                              res[1] = (-b + root)/(2*a);
                              num = 2; // don't bother distinguishing 1-solution case, as code below will still work
                           }
                        }
                     } else {
                        float b = 3*(ax*bx + ay*by) * a_inv; // could precompute this as it doesn't depend on sample point
                        float c = (2*(ax*ax + ay*ay) + (mx*bx+my*by)) * a_inv;
                        float d = (mx*ax+my*ay) * a_inv;
                        num = stbtt__solve_cubic(b, c, d, res);
                     }
                     if (num >= 1 && res[0] >= 0.0f && res[0] <= 1.0f) {
                        t = res[0], it = 1.0f - t;
                        px = it*it*x0 + 2*t*it*x1 + t*t*x2;
                        py = it*it*y0 + 2*t*it*y1 + t*t*y2;
                        dist2 = (px-sx)*(px-sx) + (py-sy)*(py-sy);
                        if (dist2 < min_dist * min_dist)
                           min_dist = (float) STBTT_sqrt(dist2);
                     }
                     if (num >= 2 && res[1] >= 0.0f && res[1] <= 1.0f) {
                        t = res[1], it = 1.0f - t;
                        px = it*it*x0 + 2*t*it*x1 + t*t*x2;
                        py = it*it*y0 + 2*t*it*y1 + t*t*y2;
                        dist2 = (px-sx)*(px-sx) + (py-sy)*(py-sy);
                        if (dist2 < min_dist * min_dist)
                           min_dist = (float) STBTT_sqrt(dist2);
                     }
                     if (num >= 3 && res[2] >= 0.0f && res[2] <= 1.0f) {
                        t = res[2], it = 1.0f - t;
                        px = it*it*x0 + 2*t*it*x1 + t*t*x2;
                        py = it*it*y0 + 2*t*it*y1 + t*t*y2;
                        dist2 = (px-sx)*(px-sx) + (py-sy)*(py-sy);
                        if (dist2 < min_dist * min_dist)
                           min_dist = (float) STBTT_sqrt(dist2);
                     }
                  }
               }
            }
            if (winding == 0)
               min_dist = -min_dist;  // if outside the shape, value is negative
            val = onedge_value + pixel_dist_scale * min_dist;
            if (val < 0)
               val = 0;
            else if (val > 255)
               val = 255;
            data[(y-iy0)*w+(x-ix0)] = (unsigned char) val;
         }
      }
      STBTT_free(precompute, info->userdata);
      STBTT_free(verts, info->userdata);
   }
   return data;
}